

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<7u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)50>,Fixpp::Required<Fixpp::TagT<7u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<16u,Fixpp::Type::Int>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<7u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_2_>,_Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  StreamBuf<char> *pSVar2;
  long lVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  Type type;
  
  this_00 = context->cursor;
  lVar1 = *(long *)&this_00->buf->field_0x8;
  pcVar7 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar2 = this_00->buf;
    if (*(long *)&pSVar2->field_0x18 == *(long *)&pSVar2->field_0x10) {
      lVar6 = (**(code **)(*(long *)pSVar2 + 0x38))();
      bVar5 = lVar6 == 0;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      pcVar7 = "Expected value tag \'%d\', got EOF";
      type = ParsingError;
      goto LAB_004059af;
    }
    pSVar2 = this_00->buf;
    if (*(char **)&pSVar2->field_0x10 < *(char **)&pSVar2->field_0x18) {
      cVar4 = **(char **)&pSVar2->field_0x10;
    }
    else {
      cVar4 = (**(code **)(*(long *)pSVar2 + 0x48))();
    }
    if (cVar4 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar6 = *(long *)&this_00->buf->field_0x8;
  lVar3 = *(long *)&this_00->buf->field_0x10;
  bVar5 = StreamCursor::advance(this_00,1);
  if (bVar5) {
    (field->m_view).first = pcVar7;
    (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar7 + lVar6);
    *(byte *)&(tagSet->
              super_TagSet<Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>
              ).bits.super__Base_bitset<1UL>._M_w =
         (byte)(tagSet->
               super_TagSet<Fixpp::Required<Fixpp::TagT<7U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<16U,_Fixpp::Type::Int>_>_>
               ).bits.super__Base_bitset<1UL>._M_w | 0x80;
    return;
  }
  pcVar7 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_004059af:
  ParsingContext::setError(context,type,pcVar7,7);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }